

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PortConnection * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&,slang::ast::Symbol_const*&,slang::SourceRange&>
          (BumpAllocator *this,MultiPortSymbol *args,Symbol **args_1,SourceRange *args_2)

{
  PortConnection *this_00;
  SourceRange *in_RCX;
  BumpAllocator *in_RDX;
  Symbol *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  
  this_00 = (PortConnection *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  ast::PortConnection::PortConnection(this_00,in_RSI,(Symbol *)in_RDX->head,*in_RCX);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }